

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall
cs::instance_type::parse_define_structured_binding
          (instance_type *this,iterator it,bool constant,bool link)

{
  token_base **pptVar1;
  any local_60;
  iterator local_58;
  iterator local_50;
  long *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  iterator local_20;
  
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48 = (long *)0x0;
  uStack_40 = 0;
  local_58.mData = it.mData;
  local_48 = (long *)operator_new(0x18);
  *local_48 = (long)&stack0xffffffffffffffb8;
  local_48[1] = (long)this;
  *(bool *)(local_48 + 2) = constant;
  *(bool *)((long)local_48 + 0x11) = link;
  uStack_40 = 0;
  local_38 = std::
             _Function_handler<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/instance.cpp:293:13)>
             ::_M_manager;
  pcStack_30 = std::
               _Function_handler<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/instance.cpp:293:13)>
               ::_M_invoke;
  if (constant) {
    local_50 = tree_type<cs::token_base_*>::iterator::right(&stack0xffffffffffffffa8);
    pptVar1 = tree_type<cs::token_base_*>::iterator::data(&stack0xffffffffffffffb0);
    local_60.mDat = (proxy *)(*pptVar1)[1]._vptr_token_base;
    if (local_60.mDat != (proxy *)0x0) {
      (local_60.mDat)->refcount = (local_60.mDat)->refcount + 1;
    }
  }
  else {
    local_20 = tree_type<cs::token_base_*>::iterator::right(&stack0xffffffffffffffa8);
    runtime_type::parse_expr
              ((runtime_type *)&stack0xffffffffffffffa0,(iterator *)this,
               SUB81(&stack0xffffffffffffffe0,0));
  }
  local_50 = tree_type<cs::token_base_*>::iterator::left(&stack0xffffffffffffffa8);
  if ((Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
       )local_38 ==
      (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
       )0x0) {
    std::__throw_bad_function_call();
  }
  (*pcStack_30)(&stack0xffffffffffffffb8,&stack0xffffffffffffffb0,&stack0xffffffffffffffa0);
  cs_impl::any::recycle(&stack0xffffffffffffffa0);
  if ((Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
       )local_38 !=
      (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
       )0x0) {
    (*local_38)(&stack0xffffffffffffffb8,&stack0xffffffffffffffb8,3);
  }
  return;
}

Assistant:

void
	instance_type::parse_define_structured_binding(tree_type<token_base *>::iterator it, bool constant, bool link)
	{
		std::function<void(tree_type<token_base *>::iterator, const var &)> process;
		process = [&process, this, constant, link](tree_type<token_base *>::iterator it, const var &val) {
			auto &pl = static_cast<token_parallel *>(it.data())->get_parallel();
			if (val.type() != typeid(array))
				throw runtime_error("Only support structured binding with array while variable definition.");
			auto &arr = val.const_val<array>();
			if (pl.size() != arr.size())
				throw runtime_error("Unmatched structured binding while variable definition.");
			for (std::size_t i = 0; i < pl.size(); ++i) {
				if (pl[i].root().data()->get_type() == token_types::parallel)
					process(pl[i].root(), arr[i]);
				else
					storage.add_var_no_return(static_cast<token_id *>(pl[i].root().data())->get_id(),
					                          constant || link ? arr[i] : copy(arr[i]), constant);
			}
		};
		const var &val = constant ? static_cast<token_value *>(it.right().data())->get_value() : parse_expr(it.right());
		process(it.left(), val);
	}